

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O2

void __thiscall cfd::core::Serializer::AddDirectBytes(Serializer *this,ByteData256 *buffer)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_28,&buffer->data_);
  AddDirectBytes(this,local_28._M_impl.super__Vector_impl_data._M_start,
                 (int)local_28._M_impl.super__Vector_impl_data._M_finish -
                 (int)local_28._M_impl.super__Vector_impl_data._M_start);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_28);
  return;
}

Assistant:

void Serializer::AddDirectBytes(const ByteData256& buffer) {
  auto buf = buffer.GetBytes();
  AddDirectBytes(buf.data(), static_cast<uint32_t>(buf.size()));
}